

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::~IfcStyledRepresentation
          (IfcStyledRepresentation *this)

{
  IfcRepresentation::~IfcRepresentation
            ((IfcRepresentation *)this,&PTR_construction_vtable_24__00778cd0);
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}